

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O0

string * __thiscall pbrt::SpectrumMixTexture::ToString_abi_cxx11_(SpectrumMixTexture *this)

{
  string *in_RDI;
  FloatTextureHandle *in_stack_00000010;
  SpectrumTextureHandle *in_stack_00000018;
  SpectrumTextureHandle *in_stack_00000020;
  char *in_stack_00000028;
  
  StringPrintf<pbrt::SpectrumTextureHandle_const&,pbrt::SpectrumTextureHandle_const&,pbrt::FloatTextureHandle_const&>
            (in_stack_00000028,in_stack_00000020,in_stack_00000018,in_stack_00000010);
  return in_RDI;
}

Assistant:

std::string SpectrumMixTexture::ToString() const {
    return StringPrintf("[ SpectrumMixTexture tex1: %s tex2: %s amount: %s ]", tex1, tex2,
                        amount);
}